

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessHelper.h
# Opt level: O0

void Assimp::ArrayBounds<aiVector3t<float>>
               (aiVector3t<float> *in,uint size,aiVector3t<float> *min,aiVector3t<float> *max)

{
  aiVector3t<float> aVar1;
  undefined8 local_70;
  float local_68;
  undefined8 local_50;
  float local_48;
  uint local_30;
  MinMaxChooser<aiVector3t<float>_> local_29;
  uint i;
  aiVector3t<float> *max_local;
  aiVector3t<float> *min_local;
  aiVector3t<float> *paStack_10;
  uint size_local;
  aiVector3t<float> *in_local;
  
  _i = max;
  max_local = min;
  min_local._4_4_ = size;
  paStack_10 = in;
  MinMaxChooser<aiVector3t<float>_>::operator()(&local_29,min,max);
  for (local_30 = 0; local_30 < min_local._4_4_; local_30 = local_30 + 1) {
    aVar1 = std::min<float>(paStack_10 + local_30,max_local);
    local_48 = aVar1.z;
    local_50 = aVar1._0_8_;
    max_local->z = local_48;
    max_local->x = (float)(undefined4)local_50;
    max_local->y = (float)local_50._4_4_;
    aVar1 = std::max<float>(paStack_10 + local_30,_i);
    local_70 = aVar1._0_8_;
    local_68 = aVar1.z;
    _i->x = (float)(undefined4)local_70;
    _i->y = (float)local_70._4_4_;
    _i->z = local_68;
  }
  return;
}

Assistant:

inline void ArrayBounds(const T* in, unsigned int size, T& min, T& max)
{
    MinMaxChooser<T> ()(min,max);
    for (unsigned int i = 0; i < size;++i) {
        min = std::min(in[i],min);
        max = std::max(in[i],max);
    }
}